

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall TArray<OneLevel,_OneLevel>::Resize(TArray<OneLevel,_OneLevel> *this,uint amount)

{
  uint uVar1;
  uint amount_00;
  long lVar2;
  FString *pFVar3;
  
  uVar1 = this->Count;
  amount_00 = amount - uVar1;
  if (amount < uVar1 || amount_00 == 0) {
    if (amount_00 != 0) {
      DoDelete(this,amount,uVar1 - 1);
    }
  }
  else {
    Grow(this,amount_00);
    uVar1 = this->Count;
    if (uVar1 < amount) {
      pFVar3 = &this->Array[uVar1].Levelname;
      lVar2 = (ulong)amount - (ulong)uVar1;
      do {
        pFVar3->Chars = (char *)0x727dbc;
        pFVar3 = pFVar3 + 4;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      FString::NullString.RefCount = (FString::NullString.RefCount + amount) - uVar1;
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}